

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void sh4asm_parser_input_token(sh4asm_tok *tk)

{
  code *pcVar1;
  char *pcVar2;
  pattern *ppVar3;
  tok_tp tVar4;
  ulong uVar5;
  sh4asm_tok *psVar6;
  ulong uVar7;
  
  uVar7 = (ulong)n_tokens;
  if (tk->tp == SH4ASM_TOK_NEWLINE) {
    ppVar3 = tok_ptrns;
    pcVar1 = emit_div0u;
    do {
      tVar4 = ppVar3->toks[0];
      if (tVar4 == SH4ASM_TOK_NEWLINE || n_tokens == 0) {
        uVar5 = 0;
      }
      else {
        psVar6 = tokens;
        uVar5 = 0;
        do {
          if (tVar4 != psVar6->tp) goto LAB_00113565;
          tVar4 = ppVar3->toks[uVar5 + 1];
          uVar5 = uVar5 + 1;
        } while ((tVar4 != SH4ASM_TOK_NEWLINE) && (psVar6 = psVar6 + 1, uVar5 < uVar7));
      }
      if (n_tokens == (uint)uVar5 && tVar4 == SH4ASM_TOK_NEWLINE) {
        (*pcVar1)();
        n_tokens = 0;
        return;
      }
LAB_00113565:
      pcVar1 = ppVar3[1].emit;
      ppVar3 = ppVar3 + 1;
    } while (pcVar1 != (parser_emit_func)0x0);
    printf("%u tokens\n\t");
    if (n_tokens != 0) {
      psVar6 = tokens;
      uVar7 = 0;
      do {
        pcVar2 = sh4asm_tok_as_str(psVar6);
        printf("%s ",pcVar2);
        uVar7 = uVar7 + 1;
        psVar6 = psVar6 + 1;
      } while (uVar7 < n_tokens);
    }
    puts("\n");
    pcVar2 = "unrecognized pattern";
  }
  else {
    if (n_tokens < 0x20) {
      n_tokens = n_tokens + 1;
      tokens[uVar7] = *tk;
      return;
    }
    pcVar2 = "too many tokens";
  }
  sh4asm_error(pcVar2);
}

Assistant:

void sh4asm_parser_input_token(struct sh4asm_tok const *tk) {
    if (tk->tp == SH4ASM_TOK_NEWLINE) {
        process_line();
        n_tokens = 0;
    } else {
        push_token(tk);
    }
}